

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall edition_unittest::BoolParseTester::ByteSizeLong(BoolParseTester *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long local_60;
  
  sVar8 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  uVar2 = google::protobuf::RepeatedField<bool>::size
                    (&(this->field_0)._impl_.repeated_bool_lowfield_);
  if (uVar2 == 0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0x3f;
    if ((long)(int)(uVar2 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar2 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    lVar12 = (ulong)((int)lVar12 * 9 + 0x49U >> 6) + 1;
  }
  uVar3 = google::protobuf::RepeatedField<bool>::size(&(this->field_0)._impl_.packed_bool_lowfield_)
  ;
  if (uVar3 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = 0x3f;
    if ((long)(int)(uVar3 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar3 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    lVar13 = (ulong)((int)lVar13 * 9 + 0x49U >> 6) + 1;
  }
  uVar4 = google::protobuf::RepeatedField<bool>::size
                    (&(this->field_0)._impl_.repeated_bool_midfield_);
  if (uVar4 == 0) {
    local_60 = 0;
  }
  else {
    lVar14 = 0x3f;
    if ((long)(int)(uVar4 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar4 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    local_60 = (ulong)((int)lVar14 * 9 + 0x49U >> 6) + 2;
  }
  uVar5 = google::protobuf::RepeatedField<bool>::size(&(this->field_0)._impl_.packed_bool_midfield_)
  ;
  if (uVar5 == 0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0x3f;
    if ((long)(int)(uVar5 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar5 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    lVar14 = (ulong)((int)lVar14 * 9 + 0x49U >> 6) + 2;
  }
  uVar6 = google::protobuf::RepeatedField<bool>::size
                    (&(this->field_0)._impl_.repeated_bool_hifield_);
  if (uVar6 == 0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0x3f;
    if ((long)(int)(uVar6 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar6 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    lVar11 = (ulong)((int)lVar11 * 9 + 0x49U >> 6) + 4;
  }
  uVar7 = google::protobuf::RepeatedField<bool>::size(&(this->field_0)._impl_.packed_bool_hifield_);
  if (uVar7 == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0x3f;
    if ((long)(int)(uVar7 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar7 | 1) >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    lVar9 = (ulong)((int)lVar9 * 9 + 0x49U >> 6) + 4;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  sVar8 = (ulong)uVar7 + lVar9 +
          (ulong)uVar5 + lVar14 + (ulong)uVar6 + lVar11 +
          lVar13 + (ulong)uVar4 + local_60 + lVar12 + (ulong)uVar3 + sVar8 + uVar2 +
          (ulong)((uVar1 & 8) >> 3) * 5 + (ulong)((uVar1 & 2) >> 1) * 3 + (ulong)(uVar1 & 1) * 2;
  if ((uVar1 & 4) != 0) {
    uVar10 = (long)(this->field_0)._impl_.other_field_ | 1;
    lVar12 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar12 * 9 + 0x49U >> 6) + 2;
  }
  sVar8 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar8,&(this->field_0)._impl_._cached_size_);
  return sVar8;
}

Assistant:

::size_t BoolParseTester::ByteSizeLong() const {
  const BoolParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.BoolParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated bool repeated_bool_lowfield = 2;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_lowfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 1 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool_lowfield = 3 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_lowfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 1 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool_midfield = 1002;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_midfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool_midfield = 1003 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_midfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool_hifield = 1000002;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_hifield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 4 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool_hifield = 1000003 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_hifield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 4 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000008u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00000002u & cached_has_bits) * 3;
  total_size += static_cast<bool>(0x00000001u & cached_has_bits) * 2;
   {
    // int32 other_field = 99;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_other_field());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}